

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.cpp
# Opt level: O2

void __thiscall CEntity::~CEntity(CEntity *this)

{
  void *in_RSI;
  
  ~CEntity(this);
  operator_delete(this,in_RSI);
  return;
}

Assistant:

CEntity::~CEntity()
{
	GameWorld()->RemoveEntity(this);
	Server()->SnapFreeID(m_ID);
}